

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O1

char * Map_LibraryReadFormulaStep(char *pFormula,char **pStrings,int *pnStrings)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  bool bVar7;
  
  for (; *pFormula == ' '; pFormula = pFormula + 1) {
  }
  pcVar1 = pFormula;
  if (*pFormula == '\0') {
    __assert_fail("*pName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                  ,0x107,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
  }
  do {
    pcVar2 = pcVar1;
    pcVar1 = pcVar2 + 1;
    if (*pcVar2 == '\0') {
      iVar3 = 0;
      goto LAB_004004ff;
    }
  } while (*pcVar2 != '(');
  *pcVar2 = '\0';
  cVar5 = *pcVar1;
  if (cVar5 == '\0') {
    bVar7 = false;
  }
  else {
    iVar3 = 1;
    do {
      if (cVar5 == ')') {
        iVar3 = iVar3 + -1;
      }
      else if (cVar5 == '(') {
        iVar3 = iVar3 + 1;
      }
      cVar5 = pcVar2[2];
      pcVar2 = pcVar2 + 1;
    } while ((cVar5 != '\0') && (iVar3 != 0));
    bVar7 = iVar3 == 0;
  }
  if (!bVar7) {
    __assert_fail("CountPars == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                  ,0x119,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
  }
  if (*pcVar2 != ')') {
    __assert_fail("*pPar2 == \')\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                  ,0x11b,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
  }
  *pcVar2 = '\0';
  *pStrings = pcVar1;
  cVar5 = *pcVar1;
  iVar3 = 1;
  if (cVar5 != '\0') {
    lVar4 = 1;
    do {
      iVar6 = 0;
      pcVar2 = pcVar1;
      while ((pcVar1 = pcVar2 + 1, iVar6 != 0 || (cVar5 != ','))) {
        if (cVar5 == ')') {
          iVar6 = iVar6 + -1;
        }
        else if (cVar5 == '(') {
          iVar6 = iVar6 + 1;
        }
        cVar5 = *pcVar1;
        pcVar2 = pcVar1;
        if (cVar5 == '\0') {
          iVar3 = (int)lVar4;
          goto LAB_004004ff;
        }
      }
      if (cVar5 != ',') {
        __assert_fail("*pCur == \',\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                      ,300,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
      }
      *pcVar2 = '\0';
      iVar3 = iVar3 + 1;
      pStrings[lVar4] = pcVar1;
      lVar4 = lVar4 + 1;
      cVar5 = *pcVar1;
    } while (cVar5 != '\0');
  }
LAB_004004ff:
  *pnStrings = iVar3;
  return pFormula;
}

Assistant:

char * Map_LibraryReadFormulaStep( char * pFormula, char * pStrings[], int * pnStrings )
{
    char * pName, * pPar1, * pPar2, * pCur;
    int nStrings, CountPars;

    // skip leading spaces
    for ( pName = pFormula; *pName && *pName == ' '; pName++ );
    assert( *pName );
    // find the first opening parenthesis
    for ( pPar1 = pName; *pPar1 && *pPar1 != '('; pPar1++ );
    if ( *pPar1 == 0 )
    {
        *pnStrings = 0;
        return pName;
    }
    // overwrite it with space
    assert( *pPar1 == '(' );
    *pPar1 = 0;
    // find the corresponding closing parenthesis
    for ( CountPars = 1, pPar2 = pPar1 + 1; *pPar2 && CountPars; pPar2++ )
        if ( *pPar2 == '(' )
            CountPars++;
        else if ( *pPar2 == ')' )
            CountPars--;
    pPar2--;
    assert( CountPars == 0 );
    // overwrite it with space
    assert( *pPar2 == ')' );
    *pPar2 = 0;
    // save the intervals between the commas
    nStrings = 0;
    pCur = pPar1 + 1;
    while ( 1 )
    {
        // save the current string
        pStrings[ nStrings++ ] = pCur;
        // find the beginning of the next string
        for ( CountPars = 0; *pCur && (CountPars || *pCur != ','); pCur++ )
            if ( *pCur == '(' )
                CountPars++;
            else if ( *pCur == ')' )
                CountPars--;
        if ( *pCur == 0 )
            break;
        assert( *pCur == ',' );
        *pCur = 0;
        pCur++;
    }
    // save the results and return
    *pnStrings = nStrings;
    return pName;
}